

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O3

void continuous_dist_test_integrate_pdf<trng::rayleigh_dist<long_double>>
               (rayleigh_dist<long_double> *d)

{
  longdouble *extraout_RDX;
  longdouble *extraout_RDX_00;
  longdouble *extraout_RDX_01;
  __normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_> last;
  int iVar1;
  long lVar2;
  int iVar3;
  longdouble in_ST0;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble in_ST2;
  longdouble lVar9;
  longdouble lVar10;
  longdouble in_ST4;
  longdouble lVar11;
  longdouble in_ST5;
  longdouble lVar12;
  vector<long_double,_std::allocator<long_double>_> y;
  AssertionHandler catchAssertionHandler;
  vector<long_double,_std::allocator<long_double>_> local_118;
  long local_100;
  longdouble local_f4;
  longdouble local_e8;
  AssertionHandler local_d8;
  longdouble local_88;
  SourceLineInfo local_78;
  ITransientExpression local_68;
  longdouble *local_58;
  char *local_50;
  size_t sStack_48;
  longdouble *local_40;
  StringRef local_38;
  
  lVar4 = in_ST5;
  roundl();
  local_100 = (long)ROUND(in_ST0);
  lVar2 = 0x100000;
  if (local_100 < 0x100000) {
    lVar2 = local_100;
  }
  lVar5 = *(longdouble *)&(d->P).nu_;
  logl();
  lVar9 = lVar4;
  lVar10 = lVar4;
  sqrtl();
  lVar5 = lVar5 * in_ST2;
  lVar6 = *(longdouble *)&(d->P).nu_;
  lVar11 = lVar10;
  logl();
  sqrtl();
  iVar1 = (int)lVar2;
  local_f4 = (longdouble)iVar1;
  lVar6 = (lVar6 * in_ST4 - lVar5) / local_f4;
  local_118.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_finish = (longdouble *)0x0;
  local_118.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (longdouble *)0x0;
  iVar3 = 0;
  last._M_current = extraout_RDX;
  if (-1 < iVar1) {
    do {
      lVar7 = lVar5 + lVar6 * (longdouble)iVar3;
      lVar8 = (longdouble)0;
      if (lVar8 < lVar7) {
        lVar8 = *(longdouble *)&(d->P).nu_;
        lVar12 = lVar11;
        expl();
        lVar8 = (lVar7 / (lVar8 * lVar8)) * in_ST5;
        last._M_current = extraout_RDX_00;
        in_ST5 = lVar4;
        lVar4 = lVar9;
        lVar9 = lVar10;
        lVar10 = lVar11;
        lVar11 = lVar12;
      }
      local_d8.m_assertionInfo.macroName._0_10_ = lVar8;
      if (local_118.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_118.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<long_double,_std::allocator<long_double>_>::_M_realloc_insert<long_double>
                  (&local_118,
                   (iterator)
                   local_118.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(longdouble *)&local_d8);
        last._M_current = extraout_RDX_01;
      }
      else {
        *local_118.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
         super__Vector_impl_data._M_finish = lVar8;
        local_118.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_118.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      iVar3 = iVar3 + 1;
    } while (iVar1 + 1 != iVar3);
  }
  simpson_int<__gnu_cxx::__normal_iterator<long_double*,std::vector<long_double,std::allocator<long_double>>>>
            ((value_type *)
             local_118.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_>
              )local_118.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
               super__Vector_impl_data._M_finish,last);
  lVar5 = ((longdouble)64.0 / local_f4) / local_f4;
  local_68._vptr_ITransientExpression = (_func_int **)0x2a6457;
  local_68.m_isBinaryExpression = true;
  local_68.m_result = false;
  local_68._10_6_ = 0;
  local_78.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_78.line = 0x94;
  local_88 = lVar5;
  Catch::StringRef::StringRef(&local_38,"std::abs(s - result_type(98) / result_type(100)) < tol");
  Catch::AssertionHandler::AssertionHandler
            (&local_d8,(StringRef *)&local_68,&local_78,local_38,Normal);
  lVar4 = ABS(_DAT_002a76d0 + in_ST5 * lVar6);
  local_e8 = lVar4;
  Catch::StringRef::StringRef((StringRef *)&local_78,"<");
  local_68.m_result = lVar4 < lVar5;
  local_68.m_isBinaryExpression = true;
  local_68._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00318338;
  local_58 = &local_e8;
  local_50 = local_78.file;
  sStack_48 = local_78.line;
  local_40 = &local_88;
  Catch::AssertionHandler::handleExpr(&local_d8,&local_68);
  Catch::ITransientExpression::~ITransientExpression(&local_68);
  Catch::AssertionHandler::complete(&local_d8);
  if (local_d8.m_completed == false) {
    (*(local_d8.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  if ((value_type *)
      local_118.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
      super__Vector_impl_data._M_start != (value_type *)0x0) {
    operator_delete(local_118.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void continuous_dist_test_integrate_pdf(const dist &d) {
  using result_type = typename dist::result_type;
  const int samples(static_cast<int>(std::min(
      1024ll * 1024, static_cast<long long>(std::round(
                         1 / std::sqrt(std::numeric_limits<result_type>::epsilon()))))));
  const result_type x_min{d.icdf(result_type(1) / result_type(100))};
  const result_type x_max{d.icdf(result_type(99) / result_type(100))};
  const result_type dx{(x_max - x_min) / samples};
  std::vector<result_type> y;
  for (int i{0}; i <= samples; ++i)
    y.push_back(d.pdf(x_min + i * dx));
  const result_type s{simpson_int(y.begin(), y.end()) * dx};
  const result_type tol{result_type(64) / result_type(samples) / result_type(samples)};
  REQUIRE(std::abs(s - result_type(98) / result_type(100)) < tol);
}